

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
AddAllocatedInternal<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>::TypeHandler>
          (RepeatedPtrFieldBase *this,void *value)

{
  int iVar1;
  Rep *pRVar2;
  int iVar3;
  
  pRVar2 = this->rep_;
  if (pRVar2 != (Rep *)0x0) {
    iVar3 = pRVar2->allocated_size;
    if (iVar3 < this->total_size_) {
      iVar1 = this->current_size_;
      if (iVar1 < iVar3) {
        pRVar2->elements[iVar3] = pRVar2->elements[iVar1];
      }
      pRVar2->elements[iVar1] = value;
      this->current_size_ = iVar1 + 1;
      this->rep_->allocated_size = this->rep_->allocated_size + 1;
      return;
    }
  }
  pRVar2 = this->rep_;
  if (pRVar2 == (Rep *)0x0) {
    iVar3 = this->total_size_;
LAB_00312221:
    Reserve(this,iVar3 + 1);
  }
  else {
    iVar3 = this->current_size_;
    if (iVar3 == this->total_size_) goto LAB_00312221;
    iVar1 = pRVar2->allocated_size;
    if (iVar1 == this->total_size_) {
      if (((long *)pRVar2->elements[iVar3] != (long *)0x0) && (this->arena_ == (Arena *)0x0)) {
        (**(code **)(*pRVar2->elements[iVar3] + 8))();
        pRVar2 = this->rep_;
      }
      goto LAB_00312231;
    }
    if (iVar1 <= iVar3) {
      pRVar2->allocated_size = iVar1 + 1;
      goto LAB_00312231;
    }
    pRVar2->elements[iVar1] = pRVar2->elements[iVar3];
  }
  pRVar2 = this->rep_;
  pRVar2->allocated_size = pRVar2->allocated_size + 1;
LAB_00312231:
  iVar3 = this->current_size_;
  this->current_size_ = iVar3 + 1;
  pRVar2->elements[iVar3] = value;
  return;
}

Assistant:

void RepeatedPtrFieldBase::AddAllocatedInternal(
    typename TypeHandler::Type* value,
    google::protobuf::internal::false_type) {
  if (rep_ &&  rep_->allocated_size < total_size_) {
    // Fast path: underlying arena representation (tagged pointer) is equal to
    // our arena pointer, and we can add to array without resizing it (at least
    // one slot that is not allocated).
    void** elems = rep_->elements;
    if (current_size_ < rep_->allocated_size) {
      // Make space at [current] by moving first allocated element to end of
      // allocated list.
      elems[rep_->allocated_size] = elems[current_size_];
    }
    elems[current_size_] = value;
    current_size_ = current_size_ + 1;
    ++rep_->allocated_size;
    return;
  } else {
    UnsafeArenaAddAllocated<TypeHandler>(value);
  }
}